

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

result_type time_plain<trng::mt19937_64>(mt19937_64 *r)

{
  long lVar1;
  result_type rVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  string res;
  string local_40;
  double local_20;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  iVar4 = (r->S).mti;
  rVar2 = 0;
  lVar3 = 0;
  do {
    if (0x137 < iVar4) {
      lVar5 = -0x9c;
      do {
        uVar6 = (uint)(r->S).mt[lVar5 + 0x9d];
        (r->S).mt[lVar5 + 0x9c] =
             *(ulong *)(&DAT_0011c230 + (ulong)(uVar6 & 1) * 8) ^ r[1].S.mt[lVar5 + -2] ^
             ((ulong)(uVar6 & 0x7ffffffe) | (r->S).mt[lVar5 + 0x9c] & 0xffffffff80000000) >> 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0);
      lVar5 = 0;
      do {
        uVar6 = (uint)(r->S).mt[lVar5 + 0x9d];
        (r->S).mt[lVar5 + 0x9c] =
             *(ulong *)(&DAT_0011c230 + (ulong)(uVar6 & 1) * 8) ^ (r->S).mt[lVar5] ^
             ((ulong)(uVar6 & 0x7ffffffe) | (r->S).mt[lVar5 + 0x9c] & 0xffffffff80000000) >> 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x9b);
      uVar6 = (uint)(r->S).mt[0];
      (r->S).mt[0x137] =
           *(ulong *)(&DAT_0011c230 + (ulong)(uVar6 & 1) * 8) ^ (r->S).mt[0x9b] ^
           ((ulong)(uVar6 & 0x7ffffffe) | (r->S).mt[0x137] & 0xffffffff80000000) >> 1;
      iVar4 = 0;
    }
    lVar5 = (long)iVar4;
    iVar4 = iVar4 + 1;
    uVar7 = (r->S).mt[lVar5];
    uVar7 = uVar7 >> 0x1d & 0x555555555 ^ uVar7;
    uVar7 = (uVar7 & 0x38eb3ffff6d3) << 0x11 ^ uVar7;
    uVar7 = (ulong)((uint)uVar7 & 0x7ffbf77) << 0x25 ^ uVar7;
    rVar2 = rVar2 + (uVar7 >> 0x2b ^ uVar7);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1000000);
  (r->S).mti = iVar4;
  lVar3 = std::chrono::_V2::system_clock::now();
  local_20 = 16.777216 / ((double)((lVar3 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_40,&local_20);
  while (local_40._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return rVar2;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}